

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O2

unique_ptr<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_> __thiscall
wabt::MakeUnique<wabt::MemoryImport,std::__cxx11::string&>
          (wabt *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  string_view name;
  MemoryImport *this_00;
  
  this_00 = (MemoryImport *)operator_new(0x88);
  name.data_ = (args->_M_dataplus)._M_p;
  name.size_ = args->_M_string_length;
  MemoryImport::MemoryImport(this_00,name);
  *(MemoryImport **)this = this_00;
  return (__uniq_ptr_data<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>,_true,_true>)
         (__uniq_ptr_data<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}